

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O3

void pbrt::ComputeBeamDiffusionBSSRDF(Float g,Float eta,BSSRDFTable *t)

{
  undefined8 *puVar1;
  ulong uVar2;
  long end;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long in_RDI;
  long lVar6;
  int iVar7;
  float fVar8;
  undefined4 in_XMM2_Da;
  undefined1 in_register_00001284 [12];
  undefined1 local_70 [4];
  undefined1 local_6c [4];
  undefined1 local_68 [8];
  long *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  *puVar1 = 0x3b23d70a00000000;
  uVar2 = *(ulong *)(in_RDI + 0x38);
  if (2 < uVar2) {
    fVar8 = *(float *)((long)puVar1 + 4);
    uVar5 = 2;
    do {
      fVar8 = fVar8 * 1.2;
      *(float *)((long)puVar1 + uVar5 * 4) = fVar8;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  end = *(long *)(in_RDI + 0x18);
  if (end != 0) {
    lVar3 = *(long *)(in_RDI + 8);
    iVar7 = 0;
    lVar6 = 0;
    auVar4._4_12_ = in_register_00001284;
    auVar4._0_4_ = in_XMM2_Da;
    auVar4 = vcvtusi2ss_avx512f(auVar4,end + -1);
    do {
      fVar8 = expf((float)iVar7 / auVar4._0_4_);
      iVar7 = iVar7 + -8;
      *(float *)(lVar3 + lVar6 * 4) = (1.0 - fVar8) / 0.99966455;
      lVar6 = lVar6 + 1;
    } while (end != lVar6);
  }
  local_58 = 0;
  local_60 = (long *)operator_new(0x18);
  *local_60 = (long)local_68;
  local_60[1] = (long)local_6c;
  local_60[2] = (long)local_70;
  local_48 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.cpp:112:42)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.cpp:112:42)>
             ::_M_manager;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  local_40._M_unused._M_object = &local_60;
  ParallelFor(0,end,(function<void_(long,_long)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] = (1 - std::exp(-8 * i / (Float)(t->rhoSamples.size() - 1))) /
                           (1 - std::exp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] =
            IntegrateCatmullRom(t->radiusSamples, {&t->profile[i * nSamples], nSamples},
                                {&t->profileCDF[i * nSamples], nSamples});
    });
}